

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O3

void libyuv::ScalePlaneDown38
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_ptr,uint8_t *dst_ptr,FilterMode filtering)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  code *pcVar7;
  int iVar8;
  code *UNRECOVERED_JUMPTABLE;
  long lVar9;
  long lVar10;
  
  lVar10 = CONCAT44(in_register_0000008c,dst_stride);
  lVar9 = CONCAT44(in_register_00000084,src_stride);
  iVar6 = 0;
  if ((int)src_ptr != 1) {
    iVar6 = dst_width;
  }
  if ((int)src_ptr == 0) {
    UNRECOVERED_JUMPTABLE = ScaleRowDown38_C;
    pcVar7 = ScaleRowDown38_C;
  }
  else {
    UNRECOVERED_JUMPTABLE = ScaleRowDown38_3_Box_C;
    pcVar7 = ScaleRowDown38_2_Box_C;
  }
  uVar1 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar1 = InitCpuFlags();
  }
  if ((uVar1 & 0x40) != 0) {
    if ((int)src_ptr == 0) {
      UNRECOVERED_JUMPTABLE = ScaleRowDown38_Any_SSSE3;
      pcVar7 = ScaleRowDown38_Any_SSSE3;
    }
    else {
      UNRECOVERED_JUMPTABLE = ScaleRowDown38_3_Box_Any_SSSE3;
      pcVar7 = ScaleRowDown38_2_Box_Any_SSSE3;
    }
    if (src_width +
        (((uint)(src_width / 6 + (src_width >> 0x1f)) >> 1) - (src_width >> 0x1f)) * -0xc == 0 &&
        (int)src_ptr == 0) {
      UNRECOVERED_JUMPTABLE = ScaleRowDown38_SSSE3;
      pcVar7 = ScaleRowDown38_SSSE3;
    }
    uVar1 = src_width * -0x55555555 + 0x2aaaaaaa;
    if ((int)src_ptr != 0 && (uVar1 >> 1 | (uint)((uVar1 & 1) != 0) << 0x1f) < 0x2aaaaaab) {
      UNRECOVERED_JUMPTABLE = ScaleRowDown38_3_Box_SSSE3;
      pcVar7 = ScaleRowDown38_2_Box_SSSE3;
    }
  }
  if (2 < src_height) {
    lVar2 = (long)iVar6;
    lVar5 = (long)(dst_width * 3);
    lVar3 = (long)dst_height;
    iVar8 = 0;
    lVar4 = lVar9;
    do {
      (*UNRECOVERED_JUMPTABLE)(lVar4,lVar2,lVar10,src_width);
      (*UNRECOVERED_JUMPTABLE)(lVar5 + lVar4,lVar2,lVar10 + lVar3,src_width);
      lVar9 = lVar5 + lVar4 + lVar5 + (long)(dst_width * 2);
      lVar10 = lVar10 + lVar3 + lVar3;
      (*pcVar7)(lVar4 + lVar5 * 2,lVar2,lVar10,src_width);
      lVar10 = lVar10 + lVar3;
      iVar8 = iVar8 + 3;
      lVar4 = lVar9;
    } while (iVar8 < src_height + -2);
  }
  if (src_height % 3 != 1) {
    if (src_height % 3 != 2) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)(lVar9,(long)iVar6,lVar10,src_width);
    lVar9 = dst_width * 3 + lVar9;
    lVar10 = dst_height + lVar10;
  }
  (*UNRECOVERED_JUMPTABLE)(lVar9,0,lVar10,src_width);
  return;
}

Assistant:

static void ScalePlaneDown38(int src_width,
                             int src_height,
                             int dst_width,
                             int dst_height,
                             int src_stride,
                             int dst_stride,
                             const uint8_t* src_ptr,
                             uint8_t* dst_ptr,
                             enum FilterMode filtering) {
  int y;
  void (*ScaleRowDown38_3)(const uint8_t* src_ptr, ptrdiff_t src_stride,
                           uint8_t* dst_ptr, int dst_width);
  void (*ScaleRowDown38_2)(const uint8_t* src_ptr, ptrdiff_t src_stride,
                           uint8_t* dst_ptr, int dst_width);
  const int filter_stride = (filtering == kFilterLinear) ? 0 : src_stride;
  assert(dst_width % 3 == 0);
  (void)src_width;
  (void)src_height;
  if (!filtering) {
    ScaleRowDown38_3 = ScaleRowDown38_C;
    ScaleRowDown38_2 = ScaleRowDown38_C;
  } else {
    ScaleRowDown38_3 = ScaleRowDown38_3_Box_C;
    ScaleRowDown38_2 = ScaleRowDown38_2_Box_C;
  }

#if defined(HAS_SCALEROWDOWN38_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    if (!filtering) {
      ScaleRowDown38_3 = ScaleRowDown38_Any_NEON;
      ScaleRowDown38_2 = ScaleRowDown38_Any_NEON;
    } else {
      ScaleRowDown38_3 = ScaleRowDown38_3_Box_Any_NEON;
      ScaleRowDown38_2 = ScaleRowDown38_2_Box_Any_NEON;
    }
    if (dst_width % 12 == 0) {
      if (!filtering) {
        ScaleRowDown38_3 = ScaleRowDown38_NEON;
        ScaleRowDown38_2 = ScaleRowDown38_NEON;
      } else {
        ScaleRowDown38_3 = ScaleRowDown38_3_Box_NEON;
        ScaleRowDown38_2 = ScaleRowDown38_2_Box_NEON;
      }
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN38_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    if (!filtering) {
      ScaleRowDown38_3 = ScaleRowDown38_Any_SSSE3;
      ScaleRowDown38_2 = ScaleRowDown38_Any_SSSE3;
    } else {
      ScaleRowDown38_3 = ScaleRowDown38_3_Box_Any_SSSE3;
      ScaleRowDown38_2 = ScaleRowDown38_2_Box_Any_SSSE3;
    }
    if (dst_width % 12 == 0 && !filtering) {
      ScaleRowDown38_3 = ScaleRowDown38_SSSE3;
      ScaleRowDown38_2 = ScaleRowDown38_SSSE3;
    }
    if (dst_width % 6 == 0 && filtering) {
      ScaleRowDown38_3 = ScaleRowDown38_3_Box_SSSE3;
      ScaleRowDown38_2 = ScaleRowDown38_2_Box_SSSE3;
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN38_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    if (!filtering) {
      ScaleRowDown38_3 = ScaleRowDown38_Any_MSA;
      ScaleRowDown38_2 = ScaleRowDown38_Any_MSA;
    } else {
      ScaleRowDown38_3 = ScaleRowDown38_3_Box_Any_MSA;
      ScaleRowDown38_2 = ScaleRowDown38_2_Box_Any_MSA;
    }
    if (dst_width % 12 == 0) {
      if (!filtering) {
        ScaleRowDown38_3 = ScaleRowDown38_MSA;
        ScaleRowDown38_2 = ScaleRowDown38_MSA;
      } else {
        ScaleRowDown38_3 = ScaleRowDown38_3_Box_MSA;
        ScaleRowDown38_2 = ScaleRowDown38_2_Box_MSA;
      }
    }
  }
#endif

  for (y = 0; y < dst_height - 2; y += 3) {
    ScaleRowDown38_3(src_ptr, filter_stride, dst_ptr, dst_width);
    src_ptr += src_stride * 3;
    dst_ptr += dst_stride;
    ScaleRowDown38_3(src_ptr, filter_stride, dst_ptr, dst_width);
    src_ptr += src_stride * 3;
    dst_ptr += dst_stride;
    ScaleRowDown38_2(src_ptr, filter_stride, dst_ptr, dst_width);
    src_ptr += src_stride * 2;
    dst_ptr += dst_stride;
  }

  // Remainder 1 or 2 rows with last row vertically unfiltered
  if ((dst_height % 3) == 2) {
    ScaleRowDown38_3(src_ptr, filter_stride, dst_ptr, dst_width);
    src_ptr += src_stride * 3;
    dst_ptr += dst_stride;
    ScaleRowDown38_3(src_ptr, 0, dst_ptr, dst_width);
  } else if ((dst_height % 3) == 1) {
    ScaleRowDown38_3(src_ptr, 0, dst_ptr, dst_width);
  }
}